

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

void P_TraceBleed(int damage,AActor *target,AActor *missile)

{
  double dVar1;
  double dVar2;
  DAngle local_58;
  undefined1 local_50 [16];
  DObject *pDStack_40;
  DObject *local_38;
  
  if ((target != (AActor *)0x0) && (((missile->flags3).Value & 0x8000000) == 0)) {
    dVar2 = (missile->Vel).Z;
    local_58.Degrees = 0.0;
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      dVar1 = AActor::Distance2D(target,missile,false);
      dVar2 = c_atan(dVar2 / dVar1);
      local_58.Degrees = dVar2 * -57.29577951308232;
    }
    local_38 = (DObject *)(target->Height * 0.5 + (target->__Pos).Z);
    local_50._8_8_ = (target->__Pos).X;
    pDStack_40 = (DObject *)(target->__Pos).Y;
    AActor::AngleTo((AActor *)local_50,missile,SUB81(target,0));
    P_TraceBleed(damage,(DVector3 *)(local_50 + 8),target,(DAngle *)local_50,&local_58);
  }
  return;
}

Assistant:

void P_TraceBleed(int damage, AActor *target, AActor *missile)
{
	DAngle pitch;

	if (target == NULL || missile->flags3 & MF3_BLOODLESSIMPACT)
	{
		return;
	}

	if (missile->Vel.Z != 0)
	{
		double aim;

		aim = g_atan(missile->Vel.Z / target->Distance2D(missile));
		pitch = -DAngle::ToDegrees(aim);
	}
	else
	{
		pitch = 0.;
	}
	P_TraceBleed(damage, target->PosPlusZ(target->Height/2), target, missile->AngleTo(target), pitch);
}